

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O3

bool __thiscall
tetgenmesh::lu_decmp(tetgenmesh *this,double (*lu) [4],int n,int *ps,double *d,int N)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  double *pdVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  double *pdVar10;
  long lVar11;
  int *piVar12;
  long lVar13;
  int iVar14;
  double dVar15;
  double dVar16;
  double adStack_58 [5];
  double scales [4];
  
  *d = 1.0;
  iVar4 = N + n;
  if (0 < n) {
    lVar7 = (long)N;
    pdVar10 = (double *)((long)lu + lVar7 * 0x28);
    lVar11 = lVar7;
    do {
      pdVar6 = pdVar10;
      lVar13 = lVar7;
      dVar15 = 0.0;
      do {
        dVar16 = ABS(*pdVar6);
        if (ABS(*pdVar6) <= dVar15) {
          dVar16 = dVar15;
        }
        lVar13 = lVar13 + 1;
        pdVar6 = pdVar6 + 1;
        dVar15 = dVar16;
      } while (lVar13 < iVar4);
      if ((dVar16 == 0.0) && (!NAN(dVar16))) {
        return false;
      }
      adStack_58[lVar11] = 1.0 / dVar16;
      ps[lVar11] = (int)lVar11;
      lVar11 = lVar11 + 1;
      pdVar10 = pdVar10 + 4;
    } while (lVar11 < iVar4);
  }
  iVar1 = iVar4 + -1;
  if (N < iVar1) {
    piVar12 = ps + N;
    iVar9 = N + 1;
    iVar5 = n + -1;
    iVar14 = 0;
    lVar11 = (long)N;
    do {
      if (iVar4 <= lVar11) {
        return false;
      }
      lVar7 = lVar11 + 1;
      lVar13 = (long)(int)lVar7;
      lVar8 = 0;
      dVar15 = 0.0;
      do {
        dVar16 = ABS(lu[piVar12[lVar8]][lVar11]) * adStack_58[piVar12[lVar8]];
        iVar2 = N + (int)lVar8;
        if (dVar16 <= dVar15) {
          dVar16 = dVar15;
          iVar2 = iVar14;
        }
        iVar14 = iVar2;
        lVar8 = lVar8 + 1;
        dVar15 = dVar16;
      } while (n != (int)lVar8);
      if ((dVar16 == 0.0) && (!NAN(dVar16))) {
        return false;
      }
      if (iVar14 != (int)lVar11) {
        iVar2 = ps[lVar11];
        ps[lVar11] = ps[iVar14];
        ps[iVar14] = iVar2;
        *d = -*d;
      }
      if (lVar7 < iVar4) {
        iVar2 = ps[lVar11];
        dVar15 = lu[iVar2][lVar11];
        do {
          iVar3 = ps[lVar13];
          dVar16 = lu[iVar3][lVar11] / dVar15;
          lu[iVar3][lVar11] = dVar16;
          if ((dVar16 != 0.0) || (NAN(dVar16))) {
            lVar8 = 0;
            do {
              lu[iVar3][iVar9 + lVar8] =
                   lu[iVar2][iVar9 + lVar8] * -dVar16 + lu[iVar3][iVar9 + lVar8];
              lVar8 = lVar8 + 1;
            } while (iVar5 != (int)lVar8);
          }
          lVar13 = lVar13 + 1;
        } while (iVar4 != (int)lVar13);
      }
      piVar12 = piVar12 + 1;
      N = N + 1;
      n = n + -1;
      iVar9 = iVar9 + 1;
      iVar5 = iVar5 + -1;
      lVar11 = lVar7;
    } while (iVar1 != (int)lVar7);
  }
  return (bool)(-(lu[ps[iVar1]][iVar1] != 0.0) & 1);
}

Assistant:

bool tetgenmesh::lu_decmp(REAL lu[4][4], int n, int* ps, REAL* d, int N)
{
  REAL scales[4];
  REAL pivot, biggest, mult, tempf;
  int pivotindex = 0;
  int i, j, k;

  *d = 1.0;                                      // No row interchanges yet.

  for (i = N; i < n + N; i++) {                             // For each row.
    // Find the largest element in each row for row equilibration
    biggest = 0.0;
    for (j = N; j < n + N; j++)
      if (biggest < (tempf = fabs(lu[i][j])))
        biggest  = tempf;
    if (biggest != 0.0)
      scales[i] = 1.0 / biggest;
    else {
      scales[i] = 0.0;
      return false;                            // Zero row: singular matrix.
    }
    ps[i] = i;                                 // Initialize pivot sequence.
  }

  for (k = N; k < n + N - 1; k++) {                      // For each column.
    // Find the largest element in each column to pivot around.
    biggest = 0.0;
    for (i = k; i < n + N; i++) {
      if (biggest < (tempf = fabs(lu[ps[i]][k]) * scales[ps[i]])) {
        biggest = tempf;
        pivotindex = i;
      }
    }
    if (biggest == 0.0) {
      return false;                         // Zero column: singular matrix.
    }
    if (pivotindex != k) {                         // Update pivot sequence.
      j = ps[k];
      ps[k] = ps[pivotindex];
      ps[pivotindex] = j;
      *d = -(*d);                          // ...and change the parity of d.
    }

    // Pivot, eliminating an extra variable  each time
    pivot = lu[ps[k]][k];
    for (i = k + 1; i < n + N; i++) {
      lu[ps[i]][k] = mult = lu[ps[i]][k] / pivot;
      if (mult != 0.0) {
        for (j = k + 1; j < n + N; j++)
          lu[ps[i]][j] -= mult * lu[ps[k]][j];
      }
    }
  }

  // (lu[ps[n + N - 1]][n + N - 1] == 0.0) ==> A is singular.
  return lu[ps[n + N - 1]][n + N - 1] != 0.0;
}